

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O3

int __thiscall
CVmObjByteArray::getp_packBytes(CVmObjByteArray *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  int argc;
  ulong uVar5;
  CVmByteArraySource dst;
  CVmDataSource local_60;
  vm_obj_id_t local_58;
  CVmObjPageEntry *local_50;
  ulong local_48;
  undefined8 local_40;
  ulong local_38;
  undefined8 local_30;
  
  if (oargc == (uint *)0x0) {
    argc = -1;
  }
  else {
    argc = *oargc - 1;
  }
  if (getp_packBytes(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_packBytes();
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,oargc,&getp_packBytes::desc);
  if (iVar2 == 0) {
    uVar3 = CVmBif::pop_long_val();
    if ((int)uVar3 < 1) {
      uVar5 = 0;
    }
    else {
      uVar1 = *(uint *)(this->super_CVmObject).ext_;
      if (uVar1 < uVar3) {
        uVar3 = uVar1;
      }
      uVar5 = (ulong)uVar3 - 1;
    }
    local_60._vptr_CVmDataSource = (_func_int **)&PTR__CVmDataSource_003607d8;
    local_30 = 0;
    local_50 = G_obj_table_X.pages_[self >> 0xc] + (self & 0xfff);
    local_40 = 0;
    local_38 = (ulong)**(uint **)((long)&local_50->ptr_ + 8);
    uVar4 = 0;
    if (((long)uVar5 < 0) || (uVar4 = local_38, local_48 = uVar5, local_38 < uVar5)) {
      local_48 = uVar4;
    }
    local_58 = self;
    CVmPack::pack(0,argc,&local_60);
    sp_ = sp_ + -(long)argc;
    retval->typ = VM_INT;
    (retval->val).obj = (int)local_48 - ((int)uVar5 + (int)local_40);
  }
  return 1;
}

Assistant:

int CVmObjByteArray::getp_packBytes(
    VMG_ vm_obj_id_t self, vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = oargc != 0 ? *oargc : 0;
    static CVmNativeCodeDesc desc(2, 0, TRUE);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* retrieve the starting index from the first argument */
    long idx = CVmBif::pop_long_val(vmg0_);
    --argc;

    /* limit the index to 1..length */
    if (idx < 1)
        idx = 1;
    else if ((ulong)idx > get_element_count())
        idx = get_element_count();

    /* adjust to a zero-based index */
    --idx;

    /* set up a data source for the byte array */
    CVmByteArraySource dst(vmg_ self);

    /* seek to the starting index */
    dst.seek(idx, OSFSK_SET);

    /* do the packing */
    CVmPack::pack(vmg_ 0, argc, &dst);

    /* discard the arguments */
    G_stk->discard(argc);

    /* return the number of bytes written */
    retval->set_int(dst.get_pos() - idx);

    /* handled */
    return TRUE;
}